

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O3

void __thiscall
burst::
subset_iterator<const_int_*,_std::less<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
::subset_iterator(subset_iterator<const_int_*,_std::less<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
                  *this,int *first,int *last)

{
  int iVar1;
  int *piVar2;
  pointer ppiVar3;
  int *piVar4;
  int *piVar5;
  __normal_iterator<const_int_**,_std::vector<const_int_*,_std::allocator<const_int_*>_>_> _Var6;
  allocator_type local_19;
  
  this->m_begin = first;
  this->m_end = last;
  std::vector<const_int_*,_std::allocator<const_int_*>_>::vector
            (&this->m_subset,(long)last - (long)first >> 2,&local_19);
  this->m_subset_size = 0;
  piVar5 = this->m_begin;
  piVar2 = this->m_end;
  piVar4 = piVar5;
  if (piVar5 != piVar2) {
    do {
      piVar5 = piVar4 + 1;
      if (piVar5 == piVar2) goto LAB_001f1388;
      iVar1 = *piVar4;
      piVar4 = piVar5;
    } while (iVar1 <= *piVar5);
  }
  if (piVar5 != piVar2) {
    __assert_fail("std::is_sorted(m_begin, m_end, m_compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                  ,0x5d,
                  "burst::subset_iterator<const int *>::subset_iterator(ForwardIterator, ForwardIterator, compare_type) [ForwardIterator = const int *, Compare = std::less<void>, SubsetContainer = std::vector<const int *>]"
                 );
  }
LAB_001f1388:
  ppiVar3 = (this->m_subset).super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  _Var6 = next_subset<__gnu_cxx::__normal_iterator<int_const**,std::vector<int_const*,std::allocator<int_const*>>>,int_const*,std::less<void>>
                    (ppiVar3,ppiVar3);
  this->m_subset_size =
       (long)_Var6._M_current -
       (long)(this->m_subset).super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  return;
}

Assistant:

explicit subset_iterator
            (
                ForwardIterator first, ForwardIterator last,
                compare_type compare = compare_type{}
            ):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_subset(static_cast<std::size_t>(std::distance(m_begin, m_end))),
            m_subset_size(0),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_begin, m_end, m_compare));
            increment();
        }